

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionHandler::
handleExpr<type_safe::basic_optional<type_safe::reference_optional_storage<type_safe::nullvar_t_const,false>>const&>
          (AssertionHandler *this,
          ExprLhs<const_type_safe::basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>_&>
          *expr)

{
  ITransientExpression local_20;
  basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>
  *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result =
       (local_10->
       super_optional_storage<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>
       ).storage.pointer_ != (nullvar_t *)0x0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_002309b0;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }